

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O0

void __thiscall wasm::Metrics::Metrics(Metrics *this,bool byFunction)

{
  bool byFunction_local;
  Metrics *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::Metrics,_wasm::UnifiedExpressionVisitor<wasm::Metrics,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::Metrics,_wasm::UnifiedExpressionVisitor<wasm::Metrics,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::Metrics,_wasm::UnifiedExpressionVisitor<wasm::Metrics,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__Metrics_0309dad8;
  this->byFunction = byFunction;
  std::
  map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
  ::map(&this->counts);
  return;
}

Assistant:

Metrics(bool byFunction) : byFunction(byFunction) {}